

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# repeated_field.h
# Opt level: O3

iterator __thiscall
google::protobuf::RepeatedField<bool>::erase
          (RepeatedField<bool> *this,const_iterator first,const_iterator last)

{
  void *__dest;
  void *pvVar1;
  int iVar2;
  int iVar3;
  size_t __n;
  
  pvVar1 = this->arena_or_elements_;
  iVar3 = (int)first - (int)pvVar1;
  if (first != last) {
    iVar2 = this->current_size_;
    __dest = (void *)((long)pvVar1 + (long)iVar3);
    __n = (long)pvVar1 + ((long)iVar2 - (long)last);
    if (__n != 0) {
      memmove(__dest,last,__n);
      iVar2 = this->current_size_;
      pvVar1 = this->arena_or_elements_;
    }
    if (0 < iVar2) {
      this->current_size_ = ((int)__dest + (int)__n) - (int)pvVar1;
    }
  }
  return (iterator)((long)iVar3 + (long)pvVar1);
}

Assistant:

inline typename RepeatedField<Element>::iterator RepeatedField<Element>::erase(
    const_iterator first, const_iterator last) {
  size_type first_offset = first - cbegin();
  if (first != last) {
    Truncate(std::copy(last, cend(), begin() + first_offset) - cbegin());
  }
  return begin() + first_offset;
}